

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Gia_Gen2CodeTest(void)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  time_t tVar3;
  int iVar4;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  p->pArray = piVar2;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar4 = 4;
  do {
    uVar1 = rand();
    Vec_IntPush(p,uVar1 & 1);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  Gia_Gen2CodePrint(1,2,p);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void Gia_Gen2CodeTest()
{
    int i, nLutSize = 1, nLutNum = 2;
    Vec_Int_t * vCode = Vec_IntAlloc( (1 << nLutSize) * nLutNum );
    srand( time(NULL) );
    for ( i = 0; i < (1 << nLutSize) * nLutNum; i++ )
        Vec_IntPush( vCode, rand() & 1 );
    Gia_Gen2CodePrint( nLutSize, nLutNum, vCode );
    Vec_IntFree( vCode );
}